

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OptionalGroup_extension_lite::Clear(OptionalGroup_extension_lite *this)

{
  uint32_t cached_has_bits;
  OptionalGroup_extension_lite *this_local;
  
  (this->field_0)._impl_.a_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void OptionalGroup_extension_lite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.OptionalGroup_extension_lite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}